

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

int space_mixer_mix(mixed_segment *segment)

{
  float fVar1;
  byte bVar2;
  long *plVar3;
  mixed_buffer *pmVar4;
  undefined8 *puVar5;
  void *__s;
  long lVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  uint32_t size;
  mixed_channel_t c_1;
  ulong uVar12;
  uint32_t i;
  ulong uVar13;
  long lVar14;
  uint32_t s;
  ulong uVar15;
  undefined8 uStack_70;
  float *pfStack_68;
  long *local_60;
  undefined1 *local_58;
  ulong local_50;
  float local_44;
  float *local_40;
  float *in;
  uint32_t samples;
  
  plVar3 = (long *)segment->data;
  in._4_4_ = 0xffffffff;
  local_58 = (undefined1 *)&pfStack_68;
  bVar2 = *(byte *)((long)plVar3 + 0x542c);
  lVar6 = -(ulong)((uint)bVar2 * 8 + 0xf & 0xfffffff0);
  lVar7 = lVar6 + -0x68;
  local_44 = *(float *)(plVar3 + 0xaa1);
  local_50 = (ulong)bVar2;
  for (lVar14 = 0; uVar9 = local_50, (ulong)bVar2 * 8 != lVar14; lVar14 = lVar14 + 8) {
    pmVar4 = *(mixed_buffer **)(plVar3[2] + lVar14);
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13eead;
    mixed_buffer_request_write
              ((float **)((long)&pfStack_68 + lVar14 + lVar7 + 0x68),(uint32_t *)((long)&in + 4),
               pmVar4);
  }
  for (uVar15 = 0; uVar15 < *(uint *)(plVar3 + 1); uVar15 = uVar15 + 1) {
    puVar5 = *(undefined8 **)(*plVar3 + uVar15 * 8);
    if (puVar5 != (undefined8 *)0x0) {
      pmVar4 = (mixed_buffer *)*puVar5;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13eee1;
      mixed_buffer_request_read(&local_40,(uint32_t *)((long)&in + 4),pmVar4);
      if (in._4_4_ == 0) goto LAB_0013f019;
    }
  }
  if (in._4_4_ != 0) {
    for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
      __s = *(void **)((long)&pfStack_68 + uVar15 * 8 + lVar7 + 0x68);
      uVar12 = (ulong)in._4_4_;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13ef14;
      memset(__s,0,uVar12 << 2);
    }
    local_60 = plVar3 + 0xa8a;
    for (uVar15 = 0; uVar15 < *(uint *)(plVar3 + 1); uVar15 = uVar15 + 1) {
      puVar5 = *(undefined8 **)(*plVar3 + uVar15 * 8);
      if (puVar5 != (undefined8 *)0x0) {
        if (*(char *)(puVar5 + 0x1b) == '\x01') {
          *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13ef58;
          calculate_volumes_resolver(puVar5,plVar3);
          *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13ef63;
          calculate_pitch_shift_resolver(puVar5,plVar3);
          *(undefined1 *)(puVar5 + 0x1b) = 0;
        }
        pmVar4 = (mixed_buffer *)*puVar5;
        *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13ef7c;
        mixed_buffer_request_read(&local_40,(uint32_t *)((long)&in + 4),pmVar4);
        uVar11 = in._4_4_;
        pfVar10 = local_40;
        plVar8 = local_60;
        if ((*(float *)((long)puVar5 + 0xd4) != 1.0) || (NAN(*(float *)((long)puVar5 + 0xd4)))) {
          *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13efb2;
          fft_window_resolver(pfVar10,pfVar10,uVar11,plVar8,fft_pitch_shift_resolver,
                              (long)puVar5 + 0xd4);
        }
        uVar11 = in._4_4_;
        bVar2 = *(byte *)((long)puVar5 + 0xd1);
        for (uVar12 = 0; uVar12 != bVar2; uVar12 = uVar12 + 1) {
          lVar14 = *(long *)((long)&pfStack_68 +
                            (ulong)*(byte *)((long)puVar5 + uVar12 + 0xb0) * 8 + lVar7 + 0x68);
          fVar1 = *(float *)((long)puVar5 + uVar12 * 4 + 0x2c);
          for (uVar13 = 0; in._4_4_ != uVar13; uVar13 = uVar13 + 1) {
            *(float *)(lVar14 + uVar13 * 4) =
                 local_44 * fVar1 * local_40[uVar13] + *(float *)(lVar14 + uVar13 * 4);
          }
        }
        pmVar4 = (mixed_buffer *)*puVar5;
        *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13f011;
        mixed_buffer_finish_read(uVar11,pmVar4);
      }
    }
  }
LAB_0013f019:
  for (uVar15 = 0; size = in._4_4_, uVar9 != uVar15; uVar15 = uVar15 + 1) {
    pmVar4 = *(mixed_buffer **)(plVar3[2] + uVar15 * 8);
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x13f031;
    mixed_buffer_finish_write(size,pmVar4);
  }
  *(undefined8 *)(local_58 + -8) = 1;
  return (int)*(undefined8 *)(local_58 + -8);
}

Assistant:

VECTORIZE int space_mixer_mix(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  uint32_t samples = UINT32_MAX;
  uint32_t channels = data->channels.count;
  float *restrict outs[channels], *restrict in;
  float global_volume = data->volume;
  
  // Compute sample counts
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_request_write(&outs[c], &samples, data->out[c]);
  }
  for(uint32_t s=0; s<data->count; ++s){
    struct space_source *source = data->sources[s];
    if(!source) continue;

    mixed_buffer_request_read(&in, &samples, source->buffer);
    if(samples == 0) break;
  }

  if(0 < samples){
    for(mixed_channel_t c=0; c<channels; ++c){
      memset(outs[c], 0, samples*sizeof(float));
    }
    for(uint32_t s=0; s<data->count; ++s){
      struct space_source *source = data->sources[s];
      if(!source) continue;
      
      if(source->dirty){
        calculate_volumes(source, data);
        calculate_pitch_shift(source, data);
        source->dirty = 0;
      }

      mixed_buffer_request_read(&in, &samples, source->buffer);
      if(source->pitch != 1.0)
        fft_window(in, in, samples, &data->fft_window_data, fft_pitch_shift, &source->pitch);
      for(mixed_channel_t c=0; c<source->speaker_count; ++c){
        float *restrict out = outs[source->speakers[c]];
        float volume = global_volume*source->volumes[c];
        for(uint32_t i=0; i<samples; ++i){
          out[i] += volume * in[i];
        }
      }
      mixed_buffer_finish_read(samples, source->buffer);
    }
  }
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_finish_write(samples, data->out[c]);
  };
  return 1;
}